

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnImportMemory
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index memory_index,Limits *page_limits,uint32_t page_size)

{
  char **field;
  Module *this_00;
  uint64_t uVar1;
  Location local_80;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  Location local_50;
  
  local_80.field_1._8_8_ = field_name._M_str;
  local_80.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)field_name._M_len;
  local_60._M_str = module_name._M_str;
  local_60._M_len = module_name._M_len;
  std::make_unique<wabt::MemoryImport>();
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)(local_80.filename._M_len + 8),&local_60);
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)(local_80.filename._M_len + 0x28),
             (basic_string_view<char,_std::char_traits<char>_> *)&local_80.field_1.field_0);
  *(undefined4 *)(local_80.filename._M_len + 0x7f) = *(undefined4 *)((long)&page_limits->max + 7);
  uVar1 = page_limits->max;
  *(uint64_t *)(local_80.filename._M_len + 0x70) = page_limits->initial;
  *(uint64_t *)(local_80.filename._M_len + 0x78) = uVar1;
  *(uint32_t *)(local_80.filename._M_len + 0x88) = page_size;
  this_00 = this->module_;
  if (*(char *)(local_80.filename._M_len + 0x81) == '\x01') {
    (this_00->features_used).threads = true;
  }
  GetLocation(&local_50,this);
  field = &local_80.filename._M_str;
  std::
  make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::MemoryImport,std::default_delete<wabt::MemoryImport>>,wabt::Location>
            ((unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> *)field,
             &local_80);
  Module::AppendField(this_00,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                               *)field);
  if ((long *)local_80.filename._M_str != (long *)0x0) {
    (**(code **)(*(long *)local_80.filename._M_str + 8))();
  }
  local_80.filename._M_str = (char *)0x0;
  if ((long *)local_80.filename._M_len != (long *)0x0) {
    (**(code **)(*(long *)local_80.filename._M_len + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnImportMemory(Index import_index,
                                      std::string_view module_name,
                                      std::string_view field_name,
                                      Index memory_index,
                                      const Limits* page_limits,
                                      uint32_t page_size) {
  auto import = std::make_unique<MemoryImport>();
  import->module_name = module_name;
  import->field_name = field_name;
  import->memory.page_limits = *page_limits;
  import->memory.page_size = page_size;
  if (import->memory.page_limits.is_shared) {
    module_->features_used.threads = true;
  }
  module_->AppendField(
      std::make_unique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}